

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

string * pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>::TypeName_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x6465686172746554;
  *(undefined4 *)((long)&in_RDI->field_2 + 7) = 0x6e6f7264;
  in_RDI->_M_string_length = 0xb;
  (in_RDI->field_2)._M_local_buf[0xb] = '\0';
  return in_RDI;
}

Assistant:

static std::string TypeName() { return TGeo::TypeName(); }